

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

ArrayIndex __thiscall Json::Value::size(Value *this)

{
  byte bVar1;
  bool bVar2;
  reference this_00;
  char *pcVar3;
  size_type sVar4;
  int __c;
  iterator *__it;
  iterator local_28;
  _Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> local_20;
  const_iterator itLast;
  Value *this_local;
  
  bVar1 = this->field_0x8;
  if (bVar1 < 6) {
    this_local._4_4_ = 0;
  }
  else {
    itLast._M_node = (_Base_ptr)this;
    if (bVar1 == 6) {
      bVar2 = std::
              map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
              ::empty((this->value_).map_);
      if (bVar2) {
        this_local._4_4_ = 0;
      }
      else {
        local_28._M_node =
             (_Base_ptr)
             std::
             map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
             ::end((this->value_).map_);
        __it = &local_28;
        std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
        _Rb_tree_const_iterator(&local_20,__it);
        std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
        operator--(&local_20);
        this_00 = std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>
                  ::operator*(&local_20);
        pcVar3 = CZString::index(&this_00->first,(char *)__it,__c);
        this_local._4_4_ = (int)pcVar3 + 1;
      }
    }
    else {
      if (bVar1 != 7) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmjsoncpp/src/lib_json/json_value.cpp"
                      ,0x310,"ArrayIndex Json::Value::size() const");
      }
      sVar4 = std::
              map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
              ::size((this->value_).map_);
      this_local._4_4_ = (ArrayIndex)sVar4;
    }
  }
  return this_local._4_4_;
}

Assistant:

ArrayIndex Value::size() const {
  switch (type_) {
  case nullValue:
  case intValue:
  case uintValue:
  case realValue:
  case booleanValue:
  case stringValue:
    return 0;
#ifndef JSON_VALUE_USE_INTERNAL_MAP
  case arrayValue: // size of the array is highest index + 1
    if (!value_.map_->empty()) {
      ObjectValues::const_iterator itLast = value_.map_->end();
      --itLast;
      return (*itLast).first.index() + 1;
    }
    return 0;
  case objectValue:
    return ArrayIndex(value_.map_->size());
#else
  case arrayValue:
    return Int(value_.array_->size());
  case objectValue:
    return Int(value_.map_->size());
#endif
  }
  JSON_ASSERT_UNREACHABLE;
  return 0; // unreachable;
}